

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

FILE * tplt_open(lemon *lemp)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Boolean tpltnameinbuf;
  char *cp;
  char *tpltname;
  FILE *in;
  char buf [1000];
  lemon *lemp_local;
  
  if (user_templatename == (char *)0x0) {
    pcVar3 = strrchr(lemp->filename,0x2e);
    if (pcVar3 == (char *)0x0) {
      sprintf((char *)&in,"%s.lt",lemp->filename);
    }
    else {
      sprintf((char *)&in,"%.*s.lt",(ulong)(uint)((int)pcVar3 - (int)lemp->filename),lemp->filename)
      ;
    }
    iVar2 = access((char *)&in,4);
    if (iVar2 == 0) {
      cp = (char *)&in;
      bVar1 = true;
    }
    else {
      iVar2 = access(tplt_open::templatename,4);
      if (iVar2 != 0) {
        cp = pathsearch(lemp->argv0,tplt_open::templatename,0);
      }
      else {
        cp = tplt_open::templatename;
      }
      bVar1 = iVar2 == 0;
    }
    if (cp == (char *)0x0) {
      fprintf(_stderr,"Can\'t find the parser driver template file \"%s\".\n",
              tplt_open::templatename);
      lemp->errorcnt = lemp->errorcnt + 1;
      lemp_local = (lemon *)0x0;
    }
    else {
      lemp_local = (lemon *)fopen(cp,"rb");
      if (lemp_local == (lemon *)0x0) {
        fprintf(_stderr,"Can\'t open the template file \"%s\".\n",tplt_open::templatename);
        if (!bVar1) {
          free(cp);
        }
        lemp->errorcnt = lemp->errorcnt + 1;
        lemp_local = (lemon *)0x0;
      }
      else if (!bVar1) {
        free(cp);
      }
    }
  }
  else {
    iVar2 = access(user_templatename,4);
    if (iVar2 == -1) {
      fprintf(_stderr,"Can\'t find the parser driver template file \"%s\".\n",user_templatename);
      lemp->errorcnt = lemp->errorcnt + 1;
      lemp_local = (lemon *)0x0;
    }
    else {
      lemp_local = (lemon *)fopen(user_templatename,"rb");
      if (lemp_local == (lemon *)0x0) {
        fprintf(_stderr,"Can\'t open the template file \"%s\".\n",user_templatename);
        lemp->errorcnt = lemp->errorcnt + 1;
        lemp_local = (lemon *)0x0;
      }
    }
  }
  return (FILE *)lemp_local;
}

Assistant:

PRIVATE FILE *tplt_open(struct lemon *lemp)
{
  static char templatename[] = "lempar.c";
  char buf[1000];
  FILE *in;
  char *tpltname;
  char *cp;
  Boolean tpltnameinbuf;

  /* first, see if user specified a template filename on the command line. */
  if (user_templatename != 0) {
    if( access(user_templatename,004)==-1 ){
      fprintf(stderr,"Can't find the parser driver template file \"%s\".\n",
        user_templatename);
      lemp->errorcnt++;
      return 0;
    }
    in = fopen(user_templatename,"rb");
    if( in==0 ){
      fprintf(stderr,"Can't open the template file \"%s\".\n",
              user_templatename);
      lemp->errorcnt++;
      return 0;
    }
    return in;
  }

  cp = strrchr(lemp->filename,'.');
  if( cp ){
    sprintf(buf,"%.*s.lt",(int)(cp-lemp->filename),lemp->filename);
  }else{
    sprintf(buf,"%s.lt",lemp->filename);
  }
  if( access(buf,004)==0 ){
    tpltname = buf;
    tpltnameinbuf = LEMON_TRUE;
  }else if( access(templatename,004)==0 ){
    tpltname = templatename;
    tpltnameinbuf = LEMON_TRUE;
  }else{
    tpltname = pathsearch(lemp->argv0,templatename,0);
    tpltnameinbuf = LEMON_FALSE;
  }
  if( tpltname==0 ){
    fprintf(stderr,"Can't find the parser driver template file \"%s\".\n",
    templatename);
    lemp->errorcnt++;
    return 0;
  }
  in = fopen(tpltname,"rb");
  if( in==0 ){
    fprintf(stderr,"Can't open the template file \"%s\".\n",templatename);
    if (tpltnameinbuf == LEMON_FALSE) free(tpltname);
    lemp->errorcnt++;
    return 0;
  }
  if (tpltnameinbuf == LEMON_FALSE) free(tpltname);
  return in;
}